

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::PreciseFunc2::~PreciseFunc2(PreciseFunc2 *this)

{
  PreciseFunc2 *this_local;
  
  ~PreciseFunc2(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

PreciseFunc2	(const string& name, DoubleFunc2& func) : CFloatFunc2(name, func) {}